

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O0

void basic_test(void)

{
  uint uVar1;
  btree_blk_ops *btree_00;
  btree_kv_ops *kv_ops;
  filemgr_open_result fVar2;
  btree btree2;
  filemgr_open_result result;
  char *fname;
  uint64_t v;
  uint64_t k;
  int r;
  int i;
  filemgr_config config;
  btree btree;
  btreeblk_handle btree_handle;
  filemgr *file;
  int blocksize;
  int nodesize;
  int vsize;
  int ksize;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  err_log_callback *in_stack_00000430;
  char *in_stack_00000438;
  undefined1 in_stack_00000447;
  filemgr *in_stack_00000448;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 uVar3;
  uint32_t in_stack_fffffffffffffdf4;
  filemgr *in_stack_fffffffffffffdf8;
  btreeblk_handle *handle;
  undefined4 in_stack_fffffffffffffe00;
  uint32_t in_stack_fffffffffffffe04;
  btree_blk_ops *in_stack_fffffffffffffe08;
  char *blk_ops;
  btree *in_stack_fffffffffffffe20;
  uint8_t in_stack_fffffffffffffe30;
  bnode_flag_t in_stack_fffffffffffffe38;
  btree_meta *in_stack_fffffffffffffe40;
  long local_190;
  long local_188;
  int local_180;
  int local_17c;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined1 local_168;
  undefined2 local_158;
  btree local_118 [3];
  filemgr *local_68;
  undefined4 local_60;
  undefined4 local_5c;
  uint local_58;
  undefined4 local_54;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  local_54 = 8;
  local_58 = 8;
  local_5c = 0x50;
  local_60 = 0xa0;
  local_180 = system("rm -rf  btreeblock_testfile");
  memset(&local_178,0,0x60);
  local_178 = local_60;
  local_174 = 0;
  local_170 = 0;
  local_168 = 8;
  local_158 = 8;
  local_180 = system("rm -rf  btreeblock_testfile");
  blk_ops = "./btreeblock_testfile";
  get_filemgr_ops();
  fVar2 = filemgr_open(_vsize,_blocksize,(filemgr_config *)file,
                       (err_log_callback *)btree_handle.dirty_update_writer);
  local_68 = fVar2.file;
  btreeblk_init((btreeblk_handle *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
  btree_00 = btreeblk_get_ops();
  btree_kv_get_ku64_vu64();
  uVar1 = local_58 & 0xff;
  uVar3 = 0;
  handle = (btreeblk_handle *)0x0;
  btree_init((btree *)btree_00,blk_ops,in_stack_fffffffffffffe08,
             (btree_kv_ops *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),0,'\0',
             in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,in_stack_fffffffffffffe40);
  for (local_17c = 0; local_17c < 6; local_17c = local_17c + 1) {
    local_188 = (long)local_17c;
    local_190 = (long)(local_17c * 10);
    btree_insert(local_118,&local_188,&local_190);
  }
  btree_print_node((btree *)CONCAT44(in_stack_fffffffffffffdf4,uVar3),
                   (btree_print_func *)CONCAT44(in_stack_fffffffffffffdec,uVar1));
  for (local_17c = 6; local_17c < 0xc; local_17c = local_17c + 1) {
    local_188 = (long)local_17c;
    local_190 = (long)(local_17c * 10);
    btree_insert(local_118,&local_188,&local_190);
  }
  btree_print_node((btree *)CONCAT44(in_stack_fffffffffffffdf4,uVar3),
                   (btree_print_func *)CONCAT44(in_stack_fffffffffffffdec,uVar1));
  btreeblk_end(handle);
  local_188 = 4;
  local_190 = 0x2c;
  btree_insert(local_118,&local_188,&local_190);
  btree_print_node((btree *)CONCAT44(in_stack_fffffffffffffdf4,uVar3),
                   (btree_print_func *)CONCAT44(in_stack_fffffffffffffdec,uVar1));
  btreeblk_end(handle);
  filemgr_commit((filemgr *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 SUB81((ulong)handle >> 0x38,0),
                 (err_log_callback *)CONCAT44(in_stack_fffffffffffffdf4,uVar3));
  local_188 = 5;
  local_190 = 0x37;
  btree_insert(local_118,&local_188,&local_190);
  btree_print_node((btree *)CONCAT44(in_stack_fffffffffffffdf4,uVar3),
                   (btree_print_func *)CONCAT44(in_stack_fffffffffffffdec,uVar1));
  btreeblk_end(handle);
  filemgr_commit((filemgr *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 SUB81((ulong)handle >> 0x38,0),
                 (err_log_callback *)CONCAT44(in_stack_fffffffffffffdf4,uVar3));
  local_188 = 5;
  local_190 = 0x3b;
  btree_insert(local_118,&local_188,&local_190);
  btree_print_node((btree *)CONCAT44(in_stack_fffffffffffffdf4,uVar3),
                   (btree_print_func *)CONCAT44(in_stack_fffffffffffffdec,uVar1));
  btreeblk_end(handle);
  filemgr_commit((filemgr *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                 SUB81((ulong)handle >> 0x38,0),
                 (err_log_callback *)CONCAT44(in_stack_fffffffffffffdf4,uVar3));
  printf("re-read using root bid %lu\n",local_118[0].root_bid);
  kv_ops = (btree_kv_ops *)btreeblk_get_ops();
  btree_kv_get_ku64_vu64();
  btree_init_from_bid(in_stack_fffffffffffffe20,btree_00,(btree_blk_ops *)blk_ops,kv_ops,
                      in_stack_fffffffffffffe04,(bid_t)handle);
  btree_print_node((btree *)CONCAT44(in_stack_fffffffffffffdf4,uVar3),
                   (btree_print_func *)CONCAT44(in_stack_fffffffffffffdec,uVar1));
  btreeblk_free((btreeblk_handle *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  filemgr_close(in_stack_00000448,(bool)in_stack_00000447,in_stack_00000438,in_stack_00000430);
  filemgr_shutdown();
  if (basic_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","basic test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","basic test");
  }
  return;
}

Assistant:

void basic_test()
{
    TEST_INIT();

    int ksize = 8;
    int vsize = 8;
    int nodesize = (ksize + vsize)*4 + sizeof(struct bnode);
    int blocksize = nodesize * 2;
    struct filemgr *file;
    struct btreeblk_handle btree_handle;
    struct btree btree;
    struct filemgr_config config;
    int i, r;
    uint64_t k,v;
    char *fname = (char *) "./btreeblock_testfile";

    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    memset(&config, 0, sizeof(config));
    config.blocksize = blocksize;
    config.ncacheblock = 0;
    config.flag = 0x0;
    config.options = FILEMGR_CREATE;
    config.num_wal_shards = 8;
    r = system(SHELL_DEL" btreeblock_testfile");
    (void)r;
    filemgr_open_result result = filemgr_open(fname, get_filemgr_ops(), &config, NULL);
    file = result.file;
    btreeblk_init(&btree_handle, file, nodesize);

    btree_init(&btree, (void*)&btree_handle, btreeblk_get_ops(),
               btree_kv_get_ku64_vu64(), nodesize, ksize, vsize, 0x0, NULL);

    for (i=0;i<6;++i) {
        k = i; v = i*10;
        btree_insert(&btree, (void*)&k, (void*)&v);
    }

    btree_print_node(&btree, print_btree);
    //btree_operation_end(&btree);

    for (i=6;i<12;++i) {
        k = i; v = i*10;
        btree_insert(&btree, (void*)&k, (void*)&v);
    }

    btree_print_node(&btree, print_btree);
    btreeblk_end(&btree_handle);
    //btree_operation_end(&btree);

    k = 4;
    v = 44;
    btree_insert(&btree, (void*)&k, (void*)&v);
    btree_print_node(&btree, print_btree);
    //btree_operation_end(&btree);

    btreeblk_end(&btree_handle);
    filemgr_commit(file, true, NULL);

    k = 5;
    v = 55;
    btree_insert(&btree, (void*)&k, (void*)&v);
    btree_print_node(&btree, print_btree);
    //btree_operation_end(&btree);

    btreeblk_end(&btree_handle);
    filemgr_commit(file, true, NULL);

    k = 5;
    v = 59;
    btree_insert(&btree, (void*)&k, (void*)&v);
    btree_print_node(&btree, print_btree);
    //btree_operation_end(&btree);

    btreeblk_end(&btree_handle);
    filemgr_commit(file, true, NULL);


    struct btree btree2;

    DBG("re-read using root bid %" _F64 "\n", btree.root_bid);
    btree_init_from_bid(&btree2, (void*)&btree_handle, btreeblk_get_ops(),
                        btree_kv_get_ku64_vu64(), nodesize, btree.root_bid);
    btree_print_node(&btree2, print_btree);

    btreeblk_free(&btree_handle);

    filemgr_close(file, true, NULL, NULL);
    filemgr_shutdown();

    TEST_RESULT("basic test");
}